

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.h
# Opt level: O0

Position __thiscall
absl::lts_20250127::cord_internal::CordRepBtreeNavigator::Seek
          (CordRepBtreeNavigator *this,size_t offset)

{
  Position PVar1;
  CordRepBtree *pCVar2;
  CordRep *this_00;
  undefined1 local_48 [8];
  Position index;
  CordRepBtree *edge;
  int height;
  size_t offset_local;
  CordRepBtreeNavigator *this_local;
  size_t local_10;
  
  pCVar2 = btree(this);
  if (pCVar2 != (CordRepBtree *)0x0) {
    edge._4_4_ = this->height_;
    index.n = (size_t)this->node_[edge._4_4_];
    if (offset < (((CordRepBtree *)index.n)->super_CordRep).length) {
      _local_48 = CordRepBtree::IndexOf((CordRepBtree *)index.n,offset);
      this->index_[edge._4_4_] = local_48[0];
      while (edge._4_4_ = edge._4_4_ + -1, -1 < edge._4_4_) {
        this_00 = CordRepBtree::Edge((CordRepBtree *)index.n,(size_t)local_48);
        index.n = (size_t)CordRep::btree(this_00);
        this->node_[edge._4_4_] = (CordRepBtree *)index.n;
        _local_48 = CordRepBtree::IndexOf((CordRepBtree *)index.n,index.index);
        this->index_[edge._4_4_] = local_48[0];
      }
      this_local = (CordRepBtreeNavigator *)
                   CordRepBtree::Edge((CordRepBtree *)index.n,(size_t)local_48);
      local_10 = index.index;
    }
    else {
      this_local = (CordRepBtreeNavigator *)0x0;
      local_10 = 0;
    }
    PVar1.offset = local_10;
    PVar1.edge = (CordRep *)this_local;
    return PVar1;
  }
  __assert_fail("btree() != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                ,0xc0,
                "CordRepBtreeNavigator::Position absl::cord_internal::CordRepBtreeNavigator::Seek(size_t)"
               );
}

Assistant:

inline CordRepBtreeNavigator::Position CordRepBtreeNavigator::Seek(
    size_t offset) {
  assert(btree() != nullptr);
  int height = height_;
  CordRepBtree* edge = node_[height];
  if (ABSL_PREDICT_FALSE(offset >= edge->length)) return {nullptr, 0};
  CordRepBtree::Position index = edge->IndexOf(offset);
  index_[height] = static_cast<uint8_t>(index.index);
  while (--height >= 0) {
    edge = edge->Edge(index.index)->btree();
    node_[height] = edge;
    index = edge->IndexOf(index.n);
    index_[height] = static_cast<uint8_t>(index.index);
  }
  return {edge->Edge(index.index), index.n};
}